

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QString * QFileSystemEngine::resolveUserName(QString *__return_storage_ptr__,uint userId)

{
  passwd *ppVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar1 = getpwuid(userId);
  if (ppVar1 == (passwd *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    QByteArray::QByteArray((QByteArray *)&local_30,ppVar1->pw_name,-1);
    QString::fromLocal8Bit<void>(__return_storage_ptr__,(QByteArray *)&local_30);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEngine::resolveUserName(uint userId)
{
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD)
    long size_max = sysconf(_SC_GETPW_R_SIZE_MAX);
    if (size_max == -1)
        size_max = 1024;
    QVarLengthArray<char, 1024> buf(size_max);
#endif

#if !defined(Q_OS_INTEGRITY) && !defined(Q_OS_WASM)
    struct passwd *pw = nullptr;
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD) && !defined(Q_OS_VXWORKS)
    struct passwd entry;
    getpwuid_r(userId, &entry, buf.data(), buf.size(), &pw);
#else
    pw = getpwuid(userId);
#endif
    if (pw)
        return QFile::decodeName(QByteArray(pw->pw_name));
#else // Integrity || WASM
    Q_UNUSED(userId);
#endif
    return QString();
}